

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathRegisterAllFunctions(xmlXPathContextPtr ctxt)

{
  xmlXPathContextPtr ctxt_local;
  
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"boolean",xmlXPathBooleanFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"ceiling",xmlXPathCeilingFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"count",xmlXPathCountFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"concat",xmlXPathConcatFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"contains",xmlXPathContainsFunction);
  xmlXPathRegisterFunc(ctxt,"id",xmlXPathIdFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"false",xmlXPathFalseFunction);
  xmlXPathRegisterFunc(ctxt,"floor",xmlXPathFloorFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"last",xmlXPathLastFunction);
  xmlXPathRegisterFunc(ctxt,"lang",xmlXPathLangFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"local-name",xmlXPathLocalNameFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"not",xmlXPathNotFunction);
  xmlXPathRegisterFunc(ctxt,"name",xmlXPathNameFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"namespace-uri",xmlXPathNamespaceURIFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"normalize-space",xmlXPathNormalizeFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"number",xmlXPathNumberFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"position",xmlXPathPositionFunction);
  xmlXPathRegisterFunc(ctxt,"round",xmlXPathRoundFunction);
  xmlXPathRegisterFunc(ctxt,"string",xmlXPathStringFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"string-length",xmlXPathStringLengthFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"starts-with",xmlXPathStartsWithFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"substring",xmlXPathSubstringFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"substring-before",xmlXPathSubstringBeforeFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"substring-after",xmlXPathSubstringAfterFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"sum",xmlXPathSumFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"true",xmlXPathTrueFunction);
  xmlXPathRegisterFunc(ctxt,(xmlChar *)"translate",xmlXPathTranslateFunction);
  xmlXPathRegisterFuncNS
            (ctxt,(xmlChar *)"escape-uri",(xmlChar *)"http://www.w3.org/2002/08/xquery-functions",
             xmlXPathEscapeUriFunction);
  return;
}

Assistant:

void
xmlXPathRegisterAllFunctions(xmlXPathContextPtr ctxt)
{
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"boolean",
                         xmlXPathBooleanFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"ceiling",
                         xmlXPathCeilingFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"count",
                         xmlXPathCountFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"concat",
                         xmlXPathConcatFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"contains",
                         xmlXPathContainsFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"id",
                         xmlXPathIdFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"false",
                         xmlXPathFalseFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"floor",
                         xmlXPathFloorFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"last",
                         xmlXPathLastFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"lang",
                         xmlXPathLangFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"local-name",
                         xmlXPathLocalNameFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"not",
                         xmlXPathNotFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"name",
                         xmlXPathNameFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"namespace-uri",
                         xmlXPathNamespaceURIFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"normalize-space",
                         xmlXPathNormalizeFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"number",
                         xmlXPathNumberFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"position",
                         xmlXPathPositionFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"round",
                         xmlXPathRoundFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"string",
                         xmlXPathStringFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"string-length",
                         xmlXPathStringLengthFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"starts-with",
                         xmlXPathStartsWithFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"substring",
                         xmlXPathSubstringFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"substring-before",
                         xmlXPathSubstringBeforeFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"substring-after",
                         xmlXPathSubstringAfterFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"sum",
                         xmlXPathSumFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"true",
                         xmlXPathTrueFunction);
    xmlXPathRegisterFunc(ctxt, (const xmlChar *)"translate",
                         xmlXPathTranslateFunction);

    xmlXPathRegisterFuncNS(ctxt, (const xmlChar *)"escape-uri",
	 (const xmlChar *)"http://www.w3.org/2002/08/xquery-functions",
                         xmlXPathEscapeUriFunction);
}